

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O2

void SHMRemoveNamedObject(SHMPTR shmNamedObject)

{
  SHMPTR shmptr;
  LPVOID pvVar1;
  LPVOID pvVar2;
  LPVOID pvVar3;
  
  if (!PAL_InitializeChakraCoreCalled) {
LAB_00135a22:
    abort();
  }
  SHMLock();
  shmptr = SHMGetInfo(SIID_NAMED_OBJECTS);
  pvVar1 = SHMPtrToPtr(shmptr);
  pvVar3 = pvVar1;
  do {
    pvVar2 = pvVar1;
    if (pvVar2 == (LPVOID)0x0) {
LAB_00135a15:
      SHMRelease();
      return;
    }
    if (*(SHMPTR *)((long)pvVar2 + 0x18) == shmNamedObject) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00135a22;
      if (*(SHMPTR *)((long)pvVar3 + 0x18) == shmNamedObject) {
        SHMSetInfo(SIID_NAMED_OBJECTS,*(SHMPTR *)((long)pvVar2 + 8));
      }
      else {
        pvVar1 = SHMPtrToPtr(*(SHMPTR *)((long)pvVar2 + 8));
        if (pvVar1 == (LPVOID)0x0) {
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        else {
          *(undefined8 *)((long)pvVar3 + 8) = *(undefined8 *)((long)pvVar2 + 8);
        }
      }
      goto LAB_00135a15;
    }
    pvVar1 = SHMPtrToPtr(*(SHMPTR *)((long)pvVar2 + 8));
    pvVar3 = pvVar2;
  } while( true );
}

Assistant:

void SHMRemoveNamedObject( SHMPTR shmNamedObject )
{
    PSHM_NAMED_OBJECTS pshmLast = 0;
    PSHM_NAMED_OBJECTS pshmCurrent = 0;

    TRACE( "Entered SHMDeleteNamedObject shmNamedObject = %d\n", shmNamedObject );
    SHMLock();

    pshmCurrent =
        (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( SHMGetInfo( SIID_NAMED_OBJECTS ) );
    pshmLast = pshmCurrent;

    while ( pshmCurrent )
    {
        if ( pshmCurrent->ShmSelf == shmNamedObject )
        {
            TRACE( "Patching the list.\n" );

            /* Patch the list, and delete the object. */
            if ( pshmLast->ShmSelf == pshmCurrent->ShmSelf )
            {
                /* Either the first element or no elements left. */
                SHMSetInfo( SIID_NAMED_OBJECTS, pshmCurrent->ShmNext );
            }
            else if ( (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( pshmCurrent->ShmNext ) )
            {
                pshmLast->ShmNext = pshmCurrent->ShmNext;
            }
            else
            {
                /* Only one left. */
                pshmLast->ShmNext = 0;
            }

            break;
        }
        else
        {
            pshmLast = pshmCurrent;
            pshmCurrent = (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( pshmCurrent->ShmNext );
        }
    }

    SHMRelease();
    return;
}